

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::generateSignal(Generator *this,FunctionDef *def,int index)

{
  ArgumentDef *pAVar1;
  long lVar2;
  Data *pDVar3;
  qsizetype qVar4;
  bool bVar5;
  char *pcVar6;
  uint uVar7;
  ArgumentDef *pAVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  long in_FS_OFFSET;
  size_t sStack_b0;
  QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_const_char_(&)[10]> local_90;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((def->wasCloned != false) || (def->isAbstract != false)) goto LAB_0010b94f;
  pcVar6 = (def->type).name.d.ptr;
  pcVar10 = (def->name).d.ptr;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)&QByteArray::_empty;
  }
  pcVar9 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (char *)&QByteArray::_empty;
  }
  if (pcVar10 == (char *)0x0) {
    pcVar10 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"\n// SIGNAL %d\n%s %s::%s(",(ulong)(uint)index,pcVar6,pcVar9,pcVar10);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_58,"this",-1);
  if (def->isConst == true) {
    local_90.a.b = &(this->cdef->super_BaseDef).qualified;
    local_90.a.a = (char (*) [13])0x134c88;
    local_90.b = (char (*) [10])0x134c95;
    QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_const_char_(&)[10]>::
    convertTo<QByteArray>((QByteArray *)&local_78,&local_90);
    qVar4 = local_58.size;
    pcVar6 = local_58.ptr;
    pDVar3 = local_58.d;
    local_58.d = local_78.d;
    local_58.ptr = local_78.ptr;
    local_78.d = pDVar3;
    local_78.ptr = pcVar6;
    local_58.size = local_78.size;
    local_78.size = qVar4;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
    pcVar6 = "const";
  }
  else {
    pcVar6 = "";
  }
  if ((def->arguments).d.size == 0) {
    local_78.d = (Data *)0x1332ce;
    bVar5 = operator==(&def->normalizedType,(char **)&local_78);
    if ((!bVar5) || (def->isPrivateSignal != false)) goto LAB_0010b6d3;
    pcVar10 = local_58.ptr;
    if (local_58.ptr == (char *)0x0) {
      pcVar10 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            ")%s\n{\n    QMetaObject::activate(%s, &staticMetaObject, %d, nullptr);\n}\n",pcVar6,
            pcVar10,(ulong)(uint)index);
  }
  else {
LAB_0010b6d3:
    pAVar1 = (def->arguments).d.ptr;
    lVar2 = (def->arguments).d.size;
    uVar12 = 1;
    pAVar8 = pAVar1;
    for (lVar11 = 0; lVar2 * 0xa8 - lVar11 != 0; lVar11 = lVar11 + 0xa8) {
      if (pAVar8 != pAVar1) {
        fputs(", ",(FILE *)this->out);
      }
      if ((pAVar8->type).name.d.size != 0) {
        pcVar10 = *(char **)((long)&(pAVar1->type).name.d.ptr + lVar11);
        if (pcVar10 == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        fputs(pcVar10,(FILE *)this->out);
      }
      fprintf((FILE *)this->out," _t%d",(ulong)uVar12);
      if ((pAVar8->rightType).d.size != 0) {
        pcVar10 = *(char **)((long)&(pAVar1->rightType).d.ptr + lVar11);
        if (pcVar10 == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        fputs(pcVar10,(FILE *)this->out);
      }
      pAVar8 = pAVar8 + 1;
      uVar12 = uVar12 + 1;
    }
    uVar7 = uVar12;
    if (def->isPrivateSignal != false) {
      if ((def->arguments).d.size != 0) {
        fwrite(", ",2,1,(FILE *)this->out);
      }
      uVar7 = uVar12 + 1;
      fprintf((FILE *)this->out,"QPrivateSignal _t%d",(ulong)uVar12);
    }
    fprintf((FILE *)this->out,")%s\n{\n",pcVar6);
    if ((def->type).name.d.size != 0) {
      local_78.d = (Data *)0x1332ce;
      bVar5 = operator!=(&def->normalizedType,(char **)&local_78);
      if (bVar5) {
        local_78.size = -0x5555555555555556;
        local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_78.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        noRef((QByteArray *)&local_78,&def->normalizedType);
        pcVar6 = local_78.ptr;
        if (local_78.ptr == (char *)0x0) {
          pcVar6 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    %s _t0{};\n",pcVar6);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
      }
    }
    pcVar6 = (def->normalizedType).d.ptr;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)&QByteArray::_empty;
    }
    pcVar10 = local_58.ptr;
    if (local_58.ptr == (char *)0x0) {
      pcVar10 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"    QMetaObject::activate<%s>(%s, &staticMetaObject, %d, ",pcVar6,
            pcVar10,(ulong)(uint)index);
    local_78.d = (Data *)0x1332ce;
    bVar5 = operator==(&def->normalizedType,(char **)&local_78);
    if (bVar5) {
      pcVar6 = "nullptr";
      sStack_b0 = 7;
    }
    else {
      pcVar6 = "std::addressof(_t0)";
      sStack_b0 = 0x13;
    }
    fwrite(pcVar6,sStack_b0,1,(FILE *)this->out);
    uVar12 = 1;
    while( true ) {
      if ((int)uVar7 <= (int)uVar12) break;
      fprintf((FILE *)this->out,", _t%d",(ulong)uVar12);
      uVar12 = uVar12 + 1;
    }
    fwrite(");\n",3,1,(FILE *)this->out);
    local_78.d = (Data *)0x1332ce;
    bVar5 = operator!=(&def->normalizedType,(char **)&local_78);
    if (bVar5) {
      fwrite("    return _t0;\n",0x10,1,(FILE *)this->out);
    }
    fwrite("}\n",2,1,(FILE *)this->out);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
LAB_0010b94f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::generateSignal(const FunctionDef *def, int index)
{
    if (def->wasCloned || def->isAbstract)
        return;
    fprintf(out, "\n// SIGNAL %d\n%s %s::%s(",
            index, def->type.name.constData(), cdef->qualified.constData(), def->name.constData());

    QByteArray thisPtr = "this";
    const char *constQualifier = "";

    if (def->isConst) {
        thisPtr = "const_cast< " + cdef->qualified + " *>(this)";
        constQualifier = "const";
    }

    Q_ASSERT(!def->normalizedType.isEmpty());
    if (def->arguments.isEmpty() && def->normalizedType == "void" && !def->isPrivateSignal) {
        fprintf(out, ")%s\n{\n"
                "    QMetaObject::activate(%s, &staticMetaObject, %d, nullptr);\n"
                "}\n", constQualifier, thisPtr.constData(), index);
        return;
    }

    int offset = 1;
    const auto begin = def->arguments.cbegin();
    const auto end = def->arguments.cend();
    for (auto it = begin; it != end; ++it) {
        const ArgumentDef &a = *it;
        if (it != begin)
            fputs(", ", out);
        if (a.type.name.size())
            fputs(a.type.name.constData(), out);
        fprintf(out, " _t%d", offset++);
        if (a.rightType.size())
            fputs(a.rightType.constData(), out);
    }
    if (def->isPrivateSignal) {
        if (!def->arguments.isEmpty())
            fprintf(out, ", ");
        fprintf(out, "QPrivateSignal _t%d", offset++);
    }

    fprintf(out, ")%s\n{\n", constQualifier);
    if (def->type.name.size() && def->normalizedType != "void") {
        QByteArray returnType = noRef(def->normalizedType);
        fprintf(out, "    %s _t0{};\n", returnType.constData());
    }

    fprintf(out, "    QMetaObject::activate<%s>(%s, &staticMetaObject, %d, ",
            def->normalizedType.constData(), thisPtr.constData(), index);
    if (def->normalizedType == "void") {
        fprintf(out, "nullptr");
    } else {
        fprintf(out, "std::addressof(_t0)");
    }
    int i;
    for (i = 1; i < offset; ++i)
        fprintf(out, ", _t%d", i);
    fprintf(out, ");\n");

    if (def->normalizedType != "void")
        fprintf(out, "    return _t0;\n");
    fprintf(out, "}\n");
}